

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O0

any * shadow::pointer_detail::generic_dereference_bind_point<long_double>
                (any *__return_storage_ptr__,any *value)

{
  decay_t<long_double_*> *pplVar1;
  any *value_local;
  
  pplVar1 = any::get<long_double*>(value);
  any::any<long_double&,void,void>(__return_storage_ptr__,*pplVar1);
  return __return_storage_ptr__;
}

Assistant:

inline any
generic_dereference_bind_point(any& value)
{
    return any(*(value.get<T*>()));
}